

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

bool __thiscall QDateTime::equals(QDateTime *this,QDateTime *other)

{
  QDateTimePrivate *pQVar1;
  QDateTimePrivate *pQVar2;
  ulong uVar3;
  qint64 qVar4;
  qint64 qVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  Int IVar9;
  Int IVar10;
  bool bVar11;
  
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar6 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    uVar6 = (uint)pQVar1;
  }
  pQVar2 = (other->d).d;
  if ((uVar6 & 8) == 0) {
    if (((ulong)pQVar2 & 1) == 0) {
      pQVar2 = (QDateTimePrivate *)
               (ulong)(pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                      super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    bVar11 = ((ulong)pQVar2 & 8) == 0;
  }
  else {
    uVar6 = (uint)pQVar2;
    if (((ulong)pQVar2 & 1) == 0) {
      uVar6 = (pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
              super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    if ((uVar6 & 8) == 0) {
      bVar11 = false;
    }
    else {
      if (((ulong)pQVar1 & 1) == 0) {
        lVar8 = pQVar1->m_msecs;
      }
      else {
        lVar8 = (long)pQVar1 >> 8;
      }
      if (((ulong)pQVar2 & 1) == 0) {
        qVar4 = pQVar2->m_msecs;
      }
      else {
        qVar4 = (long)pQVar2 >> 8;
      }
      if (((ulong)pQVar1 & 1) == 0) {
        IVar9 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
      }
      else {
        IVar9 = (Int)(byte)pQVar1;
      }
      if (((ulong)pQVar2 & 1) == 0) {
        IVar10 = (pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                 super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
      }
      else {
        IVar10 = (Int)(byte)pQVar2;
      }
      if ((IVar9 != IVar10) ||
         (((IVar9 & 0x20) != 0 && (pQVar1->m_offsetFromUtc != pQVar2->m_offsetFromUtc)))) {
        uVar7 = lVar8 - qVar4;
        uVar3 = -uVar7;
        if (0 < (long)uVar7) {
          uVar3 = uVar7;
        }
        if ((!SBORROW8(lVar8,qVar4)) && (uVar3 < 0x6ddd001)) {
          qVar4 = toMSecsSinceEpoch(this);
          qVar5 = toMSecsSinceEpoch(other);
          return qVar4 == qVar5;
        }
      }
      bVar11 = lVar8 == qVar4;
    }
  }
  return bVar11;
}

Assistant:

bool QDateTime::equals(const QDateTime &other) const
{
    if (!isValid())
        return !other.isValid();
    if (!other.isValid())
        return false;

    const qint64 thisMs = getMSecs(d);
    const qint64 yourMs = getMSecs(other.d);
    if (usesSameOffset(d, other.d) || areFarEnoughApart(thisMs, yourMs))
        return thisMs == yourMs;

    // Convert to UTC and compare
    return toMSecsSinceEpoch() == other.toMSecsSinceEpoch();
}